

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

output_file * output_file_new_gz(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  output_file_gz *outgz;
  output_file *local_8;
  
  local_8 = (output_file *)calloc(1,0x50);
  __stream = _stderr;
  if (local_8 == (output_file *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"error: %s: malloc struct outgz: %s\n","output_file_new_gz",pcVar2);
    local_8 = (output_file *)0x0;
  }
  else {
    local_8->ops = &gz_file_ops;
  }
  return local_8;
}

Assistant:

static struct output_file* output_file_new_gz(void) {
  struct output_file_gz* outgz =
      reinterpret_cast<struct output_file_gz*>(calloc(1, sizeof(struct output_file_gz)));
  if (!outgz) {
    error_errno("malloc struct outgz");
    return nullptr;
  }

  outgz->out.ops = &gz_file_ops;

  return &outgz->out;
}